

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.h
# Opt level: O1

int lre_js_is_ident_next(int c)

{
  int iVar1;
  bool bVar2;
  
  if ((uint)c < 0x80) {
    bVar2 = (lre_id_continue_table_ascii[(uint)c >> 5] >> (c & 0x1fU) & 1) != 0;
  }
  else {
    iVar1 = lre_is_id_continue(c);
    bVar2 = (c & 0xfffffffeU) == 0x200c || iVar1 != 0;
  }
  return (uint)bVar2;
}

Assistant:

static inline int lre_js_is_ident_next(int c)
{
    if ((uint32_t)c < 128) {
        return (lre_id_continue_table_ascii[c >> 5] >> (c & 31)) & 1;
    } else {
        /* ZWNJ and ZWJ are accepted in identifiers */
#ifdef CONFIG_ALL_UNICODE
        return lre_is_id_continue(c) || c == 0x200C || c == 0x200D;
#else
        return !lre_is_space(c) || c == 0x200C || c == 0x200D;
#endif
    }
}